

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O1

XMLCh * __thiscall
xercesc_4_0::XMLDateTime::getTimeCanonicalRepresentation(XMLDateTime *this,MemoryManager *memMgr)

{
  XMLCh *target;
  XMLCh *pXVar1;
  int iVar2;
  undefined4 extraout_var;
  XMLSize_t maxChars;
  XMLCh *retPtr;
  XMLCh *miliEndPtr;
  XMLCh *miliStartPtr;
  XMLCh *local_60;
  int local_54;
  XMLCh *local_50;
  XMLCh *local_48;
  XMLCh *local_40;
  XMLCh *local_38;
  
  searchMiliSeconds(this,&local_38,&local_40);
  local_50 = local_40;
  maxChars = (long)local_40 - (long)local_38 >> 1;
  local_54 = this->fValue[7];
  if (memMgr == (MemoryManager *)0x0) {
    memMgr = this->fMemoryManager;
  }
  iVar2 = (*memMgr->_vptr_MemoryManager[3])
                    (memMgr,((maxChars + 1) - (ulong)(local_54 == 0)) * 2 + 0x16);
  local_60 = (XMLCh *)CONCAT44(extraout_var,iVar2);
  local_48 = local_60;
  fillString(this,&local_60,this->fValue[3],2);
  if (this->fValue[3] == 0x18) {
    local_60[-2] = L'0';
    local_60[-1] = L'0';
  }
  *local_60 = L':';
  local_60 = local_60 + 1;
  fillString(this,&local_60,this->fValue[4],2);
  *local_60 = L':';
  local_60 = local_60 + 1;
  fillString(this,&local_60,this->fValue[5],2);
  pXVar1 = local_60;
  if (local_50 != local_38) {
    target = local_60 + 1;
    *local_60 = L'.';
    local_60 = target;
    XMLString::copyNString(target,local_38,maxChars);
    local_60 = (XMLCh *)((long)pXVar1 + ((long)local_40 - (long)local_38) + 2);
  }
  if (local_54 != 0) {
    *local_60 = L'Z';
    local_60 = local_60 + 1;
  }
  *local_60 = L'\0';
  return local_48;
}

Assistant:

XMLCh* XMLDateTime::getTimeCanonicalRepresentation(MemoryManager* const memMgr) const
{
    XMLCh *miliStartPtr, *miliEndPtr;
    searchMiliSeconds(miliStartPtr, miliEndPtr);
    XMLSize_t miliSecondsLen = miliEndPtr - miliStartPtr;
    int utcSize = (fValue[utc] == UTC_UNKNOWN) ? 0 : 1;

    MemoryManager* toUse = memMgr? memMgr : fMemoryManager;
    XMLCh* retBuf = (XMLCh*) toUse->allocate( (10 + miliSecondsLen + utcSize + 1) * sizeof(XMLCh));
    XMLCh* retPtr = retBuf;

    // 'hh:mm:ss'Z'    ('.'s+)?
    //      8    1
    //

    fillString(retPtr, fValue[Hour], 2);
    if (fValue[Hour] == 24)
    {
        *(retPtr - 2) = chDigit_0;
        *(retPtr - 1) = chDigit_0;
    }
    *retPtr++ = TIME_SEPARATOR;
    fillString(retPtr, fValue[Minute], 2);
    *retPtr++ = TIME_SEPARATOR;
    fillString(retPtr, fValue[Second], 2);

    if (miliSecondsLen)
    {
        *retPtr++ = chPeriod;
        XMLString::copyNString(retPtr, miliStartPtr, miliSecondsLen);
        retPtr += miliSecondsLen;
    }

    if (utcSize)
        *retPtr++ = UTC_STD_CHAR;
    *retPtr = chNull;

    return retBuf;
}